

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  Geometry *pGVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 (*pauVar17) [16];
  AABBNodeMB4D *node1;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  undefined4 uVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [8];
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  Scene *pSVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  RTCIntersectArguments *pRVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  float fVar53;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar51;
  float fVar52;
  undefined1 auVar50 [64];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar68;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar66;
  float fVar67;
  undefined1 auVar65 [64];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar79;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar80;
  float fVar98;
  float fVar100;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar102;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar81;
  float fVar99;
  float fVar101;
  float fVar103;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar104;
  float fVar105;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar119;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar120;
  undefined1 auVar113 [16];
  float fVar118;
  float fVar121;
  undefined1 auVar114 [16];
  float fVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [64];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [64];
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar154;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar152;
  float fVar153;
  undefined1 auVar151 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  float fVar160;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar161 [64];
  float fVar165;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar166 [64];
  float fVar172;
  undefined1 auVar173 [16];
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar174 [64];
  float fVar178;
  undefined1 auVar179 [16];
  float fVar184;
  undefined1 auVar180 [16];
  float fVar182;
  float fVar183;
  undefined1 auVar181 [64];
  float fVar185;
  undefined1 auVar186 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar187 [64];
  UVIdentity<4> mapUV;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_12a1;
  ulong local_12a0;
  Scene *local_1298;
  RayQueryContext *local_1290;
  undefined1 local_1288 [16];
  undefined8 local_1278;
  float fStack_1270;
  float fStack_126c;
  undefined1 local_1268 [16];
  undefined1 local_1258 [16];
  int local_123c;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  undefined1 local_1218 [8];
  float fStack_1210;
  float fStack_120c;
  undefined1 local_1208 [16];
  undefined1 local_11f8 [8];
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [8];
  float fStack_11c0;
  float fStack_11bc;
  ulong local_11b8;
  undefined1 (*local_11b0) [16];
  long local_11a8;
  long local_11a0;
  RTCFilterFunctionNArguments local_1198;
  float local_1168;
  undefined4 local_1164;
  undefined4 local_1160;
  undefined4 local_115c;
  undefined4 local_1158;
  undefined4 local_1154;
  uint local_1150;
  uint local_114c;
  uint local_1148;
  undefined1 local_1138 [16];
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined1 local_1108 [16];
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 *local_10d8;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_11b0 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    aVar4 = (ray->super_RayK<1>).dir.field_0;
    auVar96 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar54 = (ray->super_RayK<1>).tfar;
    auVar65 = ZEXT464((uint)fVar54);
    auVar70 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar54));
    auVar86._8_4_ = 0x7fffffff;
    auVar86._0_8_ = 0x7fffffff7fffffff;
    auVar86._12_4_ = 0x7fffffff;
    auVar86 = vandps_avx((undefined1  [16])aVar4,auVar86);
    auVar123._8_4_ = 0x219392ef;
    auVar123._0_8_ = 0x219392ef219392ef;
    auVar123._12_4_ = 0x219392ef;
    auVar86 = vcmpps_avx(auVar86,auVar123,1);
    auVar124._8_4_ = 0x3f800000;
    auVar124._0_8_ = 0x3f8000003f800000;
    auVar124._12_4_ = 0x3f800000;
    auVar123 = vdivps_avx(auVar124,(undefined1  [16])aVar4);
    auVar125._8_4_ = 0x5d5e0b6b;
    auVar125._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar125._12_4_ = 0x5d5e0b6b;
    auVar86 = vblendvps_avx(auVar123,auVar125,auVar86);
    auVar106._0_4_ = auVar86._0_4_ * 0.99999964;
    auVar106._4_4_ = auVar86._4_4_ * 0.99999964;
    auVar106._8_4_ = auVar86._8_4_ * 0.99999964;
    auVar106._12_4_ = auVar86._12_4_ * 0.99999964;
    auVar82._0_4_ = auVar86._0_4_ * 1.0000004;
    auVar82._4_4_ = auVar86._4_4_ * 1.0000004;
    auVar82._8_4_ = auVar86._8_4_ * 1.0000004;
    auVar82._12_4_ = auVar86._12_4_ * 1.0000004;
    uVar21 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_fd8._4_4_ = uVar21;
    local_fd8._0_4_ = uVar21;
    local_fd8._8_4_ = uVar21;
    local_fd8._12_4_ = uVar21;
    auVar151 = ZEXT1664(local_fd8);
    uVar21 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_fe8._4_4_ = uVar21;
    local_fe8._0_4_ = uVar21;
    local_fe8._8_4_ = uVar21;
    local_fe8._12_4_ = uVar21;
    auVar158 = ZEXT1664(local_fe8);
    local_ff8 = vshufps_avx(auVar106,auVar106,0);
    auVar159 = ZEXT1664(local_ff8);
    auVar86 = vmovshdup_avx(auVar106);
    local_1008 = vshufps_avx(auVar106,auVar106,0x55);
    auVar161 = ZEXT1664(local_1008);
    auVar123 = vshufpd_avx(auVar106,auVar106,1);
    local_1018 = vshufps_avx(auVar106,auVar106,0xaa);
    auVar166 = ZEXT1664(local_1018);
    local_1028 = vshufps_avx(auVar82,auVar82,0);
    auVar174 = ZEXT1664(local_1028);
    uVar23 = (ulong)(auVar106._0_4_ < 0.0) << 4;
    local_1038 = vshufps_avx(auVar82,auVar82,0x55);
    auVar181 = ZEXT1664(local_1038);
    local_1048 = vshufps_avx(auVar82,auVar82,0xaa);
    auVar187 = ZEXT1664(local_1048);
    uVar27 = (ulong)(auVar86._0_4_ < 0.0) << 4 | 0x20;
    uVar25 = (ulong)(auVar123._0_4_ < 0.0) << 4 | 0x40;
    uVar41 = uVar23 ^ 0x10;
    uVar26 = uVar27 ^ 0x10;
    local_1058 = vshufps_avx(auVar96,auVar96,0);
    auVar144 = ZEXT1664(local_1058);
    auVar86 = vshufps_avx(auVar70,auVar70,0);
    auVar50 = ZEXT1664(auVar86);
    local_1128 = mm_lookupmask_ps._240_8_;
    uStack_1120 = mm_lookupmask_ps._248_8_;
    uVar21 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_1138._4_4_ = uVar21;
    local_1138._0_4_ = uVar21;
    local_1138._8_4_ = uVar21;
    local_1138._12_4_ = uVar21;
    auVar137 = ZEXT1664(local_1138);
    local_11b8 = uVar23;
    local_12a0 = uVar27;
    local_1290 = context;
LAB_00b701c5:
    if (local_11b0 != (undefined1 (*) [16])&local_f78) {
      pauVar17 = local_11b0 + -1;
      local_11b0 = local_11b0 + -1;
      if (*(float *)(*pauVar17 + 8) <= auVar65._0_4_) {
        uVar40 = *(ulong *)*local_11b0;
        while ((uVar40 & 8) == 0) {
          uVar18 = uVar40 & 0xfffffffffffffff0;
          fVar54 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar96._4_4_ = fVar54;
          auVar96._0_4_ = fVar54;
          auVar96._8_4_ = fVar54;
          auVar96._12_4_ = fVar54;
          pfVar3 = (float *)(uVar18 + 0x80 + uVar23);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar23);
          auVar70._0_4_ = fVar54 * *pfVar3 + *pfVar1;
          auVar70._4_4_ = fVar54 * pfVar3[1] + pfVar1[1];
          auVar70._8_4_ = fVar54 * pfVar3[2] + pfVar1[2];
          auVar70._12_4_ = fVar54 * pfVar3[3] + pfVar1[3];
          auVar86 = vsubps_avx(auVar70,auVar151._0_16_);
          auVar71._0_4_ = auVar159._0_4_ * auVar86._0_4_;
          auVar71._4_4_ = auVar159._4_4_ * auVar86._4_4_;
          auVar71._8_4_ = auVar159._8_4_ * auVar86._8_4_;
          auVar71._12_4_ = auVar159._12_4_ * auVar86._12_4_;
          pfVar3 = (float *)(uVar18 + 0x80 + uVar27);
          auVar86 = vmaxps_avx(auVar144._0_16_,auVar71);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar27);
          auVar83._0_4_ = fVar54 * *pfVar3 + *pfVar1;
          auVar83._4_4_ = fVar54 * pfVar3[1] + pfVar1[1];
          auVar83._8_4_ = fVar54 * pfVar3[2] + pfVar1[2];
          auVar83._12_4_ = fVar54 * pfVar3[3] + pfVar1[3];
          auVar123 = vsubps_avx(auVar83,auVar158._0_16_);
          pfVar3 = (float *)(uVar18 + 0x80 + uVar25);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar25);
          auVar107._0_4_ = fVar54 * *pfVar3 + *pfVar1;
          auVar107._4_4_ = fVar54 * pfVar3[1] + pfVar1[1];
          auVar107._8_4_ = fVar54 * pfVar3[2] + pfVar1[2];
          auVar107._12_4_ = fVar54 * pfVar3[3] + pfVar1[3];
          auVar84._0_4_ = auVar161._0_4_ * auVar123._0_4_;
          auVar84._4_4_ = auVar161._4_4_ * auVar123._4_4_;
          auVar84._8_4_ = auVar161._8_4_ * auVar123._8_4_;
          auVar84._12_4_ = auVar161._12_4_ * auVar123._12_4_;
          auVar123 = vsubps_avx(auVar107,auVar137._0_16_);
          auVar108._0_4_ = auVar166._0_4_ * auVar123._0_4_;
          auVar108._4_4_ = auVar166._4_4_ * auVar123._4_4_;
          auVar108._8_4_ = auVar166._8_4_ * auVar123._8_4_;
          auVar108._12_4_ = auVar166._12_4_ * auVar123._12_4_;
          auVar123 = vmaxps_avx(auVar84,auVar108);
          pfVar3 = (float *)(uVar18 + 0x80 + uVar41);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar41);
          auVar109._0_4_ = fVar54 * *pfVar3 + *pfVar1;
          auVar109._4_4_ = fVar54 * pfVar3[1] + pfVar1[1];
          auVar109._8_4_ = fVar54 * pfVar3[2] + pfVar1[2];
          auVar109._12_4_ = fVar54 * pfVar3[3] + pfVar1[3];
          local_1108 = vmaxps_avx(auVar86,auVar123);
          auVar86 = vsubps_avx(auVar109,auVar151._0_16_);
          auVar85._0_4_ = auVar174._0_4_ * auVar86._0_4_;
          auVar85._4_4_ = auVar174._4_4_ * auVar86._4_4_;
          auVar85._8_4_ = auVar174._8_4_ * auVar86._8_4_;
          auVar85._12_4_ = auVar174._12_4_ * auVar86._12_4_;
          auVar86 = vminps_avx(auVar50._0_16_,auVar85);
          pfVar3 = (float *)(uVar18 + 0x80 + uVar26);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar26);
          auVar110._0_4_ = fVar54 * *pfVar3 + *pfVar1;
          auVar110._4_4_ = fVar54 * pfVar3[1] + pfVar1[1];
          auVar110._8_4_ = fVar54 * pfVar3[2] + pfVar1[2];
          auVar110._12_4_ = fVar54 * pfVar3[3] + pfVar1[3];
          auVar123 = vsubps_avx(auVar110,auVar158._0_16_);
          auVar111._0_4_ = auVar181._0_4_ * auVar123._0_4_;
          auVar111._4_4_ = auVar181._4_4_ * auVar123._4_4_;
          auVar111._8_4_ = auVar181._8_4_ * auVar123._8_4_;
          auVar111._12_4_ = auVar181._12_4_ * auVar123._12_4_;
          pfVar3 = (float *)(uVar18 + 0x80 + (uVar25 ^ 0x10));
          pfVar1 = (float *)(uVar18 + 0x20 + (uVar25 ^ 0x10));
          auVar126._0_4_ = fVar54 * *pfVar3 + *pfVar1;
          auVar126._4_4_ = fVar54 * pfVar3[1] + pfVar1[1];
          auVar126._8_4_ = fVar54 * pfVar3[2] + pfVar1[2];
          auVar126._12_4_ = fVar54 * pfVar3[3] + pfVar1[3];
          auVar123 = vsubps_avx(auVar126,auVar137._0_16_);
          auVar127._0_4_ = auVar187._0_4_ * auVar123._0_4_;
          auVar127._4_4_ = auVar187._4_4_ * auVar123._4_4_;
          auVar127._8_4_ = auVar187._8_4_ * auVar123._8_4_;
          auVar127._12_4_ = auVar187._12_4_ * auVar123._12_4_;
          auVar123 = vminps_avx(auVar111,auVar127);
          auVar86 = vminps_avx(auVar86,auVar123);
          auVar86 = vcmpps_avx(local_1108,auVar86,2);
          if (((uint)uVar40 & 7) == 6) {
            auVar123 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0xe0),auVar96,2);
            auVar96 = vcmpps_avx(auVar96,*(undefined1 (*) [16])(uVar18 + 0xf0),1);
            auVar123 = vandps_avx(auVar123,auVar96);
            auVar86 = vandps_avx(auVar123,auVar86);
          }
          auVar86 = vpslld_avx(auVar86,0x1f);
          uVar19 = vmovmskps_avx(auVar86);
          if (uVar19 == 0) {
            auVar86 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar65 = ZEXT1664(auVar86);
            goto LAB_00b701c5;
          }
          uVar19 = uVar19 & 0xff;
          lVar34 = 0;
          if (uVar19 != 0) {
            for (; (uVar19 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
            }
          }
          uVar40 = *(ulong *)(uVar18 + lVar34 * 8);
          uVar19 = uVar19 - 1 & uVar19;
          if (uVar19 != 0) {
            uVar20 = *(uint *)(local_1108 + lVar34 * 4);
            lVar34 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
              }
            }
            uVar28 = *(ulong *)(uVar18 + lVar34 * 8);
            uVar7 = *(uint *)(local_1108 + lVar34 * 4);
            uVar19 = uVar19 - 1 & uVar19;
            uVar27 = local_12a0;
            if (uVar19 == 0) {
              if (uVar20 < uVar7) {
                *(ulong *)*local_11b0 = uVar28;
                *(uint *)(*local_11b0 + 8) = uVar7;
                local_11b0 = local_11b0 + 1;
              }
              else {
                *(ulong *)*local_11b0 = uVar40;
                *(uint *)(*local_11b0 + 8) = uVar20;
                local_11b0 = local_11b0 + 1;
                uVar40 = uVar28;
              }
            }
            else {
              auVar55._8_8_ = 0;
              auVar55._0_8_ = uVar40;
              auVar86 = vpunpcklqdq_avx(auVar55,ZEXT416(uVar20));
              auVar72._8_8_ = 0;
              auVar72._0_8_ = uVar28;
              auVar123 = vpunpcklqdq_avx(auVar72,ZEXT416(uVar7));
              lVar34 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                }
              }
              auVar87._8_8_ = 0;
              auVar87._0_8_ = *(ulong *)(uVar18 + lVar34 * 8);
              auVar70 = vpunpcklqdq_avx(auVar87,ZEXT416(*(uint *)(local_1108 + lVar34 * 4)));
              auVar96 = vpcmpgtd_avx(auVar123,auVar86);
              uVar19 = uVar19 - 1 & uVar19;
              if (uVar19 == 0) {
                auVar82 = vpshufd_avx(auVar96,0xaa);
                auVar96 = vblendvps_avx(auVar123,auVar86,auVar82);
                auVar86 = vblendvps_avx(auVar86,auVar123,auVar82);
                auVar123 = vpcmpgtd_avx(auVar70,auVar96);
                auVar82 = vpshufd_avx(auVar123,0xaa);
                auVar123 = vblendvps_avx(auVar70,auVar96,auVar82);
                auVar96 = vblendvps_avx(auVar96,auVar70,auVar82);
                auVar70 = vpcmpgtd_avx(auVar96,auVar86);
                auVar82 = vpshufd_avx(auVar70,0xaa);
                auVar70 = vblendvps_avx(auVar96,auVar86,auVar82);
                auVar86 = vblendvps_avx(auVar86,auVar96,auVar82);
                *local_11b0 = auVar86;
                local_11b0[1] = auVar70;
                uVar40 = auVar123._0_8_;
                local_11b0 = local_11b0 + 2;
              }
              else {
                lVar34 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                  }
                }
                auVar128._8_8_ = 0;
                auVar128._0_8_ = *(ulong *)(uVar18 + lVar34 * 8);
                auVar106 = vpunpcklqdq_avx(auVar128,ZEXT416(*(uint *)(local_1108 + lVar34 * 4)));
                auVar82 = vpshufd_avx(auVar96,0xaa);
                auVar96 = vblendvps_avx(auVar123,auVar86,auVar82);
                auVar86 = vblendvps_avx(auVar86,auVar123,auVar82);
                auVar123 = vpcmpgtd_avx(auVar106,auVar70);
                auVar82 = vpshufd_avx(auVar123,0xaa);
                auVar123 = vblendvps_avx(auVar106,auVar70,auVar82);
                auVar70 = vblendvps_avx(auVar70,auVar106,auVar82);
                auVar82 = vpcmpgtd_avx(auVar70,auVar86);
                auVar106 = vpshufd_avx(auVar82,0xaa);
                auVar82 = vblendvps_avx(auVar70,auVar86,auVar106);
                auVar86 = vblendvps_avx(auVar86,auVar70,auVar106);
                auVar70 = vpcmpgtd_avx(auVar123,auVar96);
                auVar106 = vpshufd_avx(auVar70,0xaa);
                auVar70 = vblendvps_avx(auVar123,auVar96,auVar106);
                auVar123 = vblendvps_avx(auVar96,auVar123,auVar106);
                auVar96 = vpcmpgtd_avx(auVar82,auVar123);
                auVar106 = vpshufd_avx(auVar96,0xaa);
                auVar96 = vblendvps_avx(auVar82,auVar123,auVar106);
                auVar123 = vblendvps_avx(auVar123,auVar82,auVar106);
                *local_11b0 = auVar86;
                local_11b0[1] = auVar123;
                local_11b0[2] = auVar96;
                auVar137 = ZEXT1664(local_1138);
                uVar40 = auVar70._0_8_;
                local_11b0 = local_11b0 + 3;
              }
            }
          }
        }
        local_11a8 = (ulong)((uint)uVar40 & 0xf) - 8;
        uVar40 = uVar40 & 0xfffffffffffffff0;
        for (local_11a0 = 0; local_11a0 != local_11a8; local_11a0 = local_11a0 + 1) {
          lVar37 = local_11a0 * 0x50;
          pSVar29 = local_1290->scene;
          pGVar8 = (pSVar29->geometries).items[*(uint *)(uVar40 + 0x30 + lVar37)].ptr;
          fVar54 = (pGVar8->time_range).lower;
          fVar54 = pGVar8->fnumTimeSegments *
                   (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar54) /
                   ((pGVar8->time_range).upper - fVar54));
          auVar86 = vroundss_avx(ZEXT416((uint)fVar54),ZEXT416((uint)fVar54),9);
          auVar86 = vminss_avx(auVar86,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
          auVar107 = vmaxss_avx(ZEXT816(0),auVar86);
          lVar22 = (long)(int)auVar107._0_4_ * 0x38;
          uVar39 = (ulong)*(uint *)(uVar40 + 4 + lVar37);
          lVar34 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar22);
          lVar22 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar22);
          auVar86 = *(undefined1 (*) [16])(lVar34 + (ulong)*(uint *)(uVar40 + lVar37) * 4);
          uVar28 = (ulong)*(uint *)(uVar40 + 0x10 + lVar37);
          auVar123 = *(undefined1 (*) [16])(lVar34 + uVar28 * 4);
          uVar30 = (ulong)*(uint *)(uVar40 + 0x20 + lVar37);
          auVar111 = *(undefined1 (*) [16])(lVar34 + uVar30 * 4);
          auVar96 = *(undefined1 (*) [16])(lVar34 + uVar39 * 4);
          uVar31 = (ulong)*(uint *)(uVar40 + 0x14 + lVar37);
          auVar70 = *(undefined1 (*) [16])(lVar34 + uVar31 * 4);
          uVar32 = (ulong)*(uint *)(uVar40 + 0x24 + lVar37);
          auVar126 = *(undefined1 (*) [16])(lVar34 + uVar32 * 4);
          uVar33 = (ulong)*(uint *)(uVar40 + 8 + lVar37);
          auVar82 = *(undefined1 (*) [16])(lVar34 + uVar33 * 4);
          uVar27 = (ulong)*(uint *)(uVar40 + 0x18 + lVar37);
          auVar106 = *(undefined1 (*) [16])(lVar34 + uVar27 * 4);
          uVar35 = (ulong)*(uint *)(uVar40 + 0x28 + lVar37);
          auVar124 = *(undefined1 (*) [16])(lVar34 + uVar35 * 4);
          uVar36 = (ulong)*(uint *)(uVar40 + 0xc + lVar37);
          auVar125 = *(undefined1 (*) [16])(lVar34 + uVar36 * 4);
          uVar23 = (ulong)*(uint *)(uVar40 + 0x1c + lVar37);
          auVar71 = *(undefined1 (*) [16])(lVar34 + uVar23 * 4);
          uVar18 = (ulong)*(uint *)(uVar40 + 0x2c + lVar37);
          auVar83 = *(undefined1 (*) [16])(lVar34 + uVar18 * 4);
          auVar84 = *(undefined1 (*) [16])(lVar22 + (ulong)*(uint *)(uVar40 + lVar37) * 4);
          auVar85 = *(undefined1 (*) [16])(lVar22 + uVar28 * 4);
          fVar54 = fVar54 - auVar107._0_4_;
          auVar107 = vunpcklps_avx(auVar86,auVar82);
          auVar82 = vunpckhps_avx(auVar86,auVar82);
          auVar108 = vunpcklps_avx(auVar96,auVar125);
          auVar96 = vunpckhps_avx(auVar96,auVar125);
          auVar86 = *(undefined1 (*) [16])(lVar22 + uVar39 * 4);
          auVar109 = vunpcklps_avx(auVar82,auVar96);
          auVar110 = vunpcklps_avx(auVar107,auVar108);
          auVar82 = vunpckhps_avx(auVar107,auVar108);
          auVar125 = vunpcklps_avx(auVar123,auVar106);
          auVar96 = vunpckhps_avx(auVar123,auVar106);
          auVar106 = vunpcklps_avx(auVar70,auVar71);
          auVar70 = vunpckhps_avx(auVar70,auVar71);
          auVar123 = *(undefined1 (*) [16])(lVar22 + uVar33 * 4);
          auVar71 = vunpcklps_avx(auVar96,auVar70);
          auVar107 = vunpcklps_avx(auVar125,auVar106);
          auVar70 = vunpckhps_avx(auVar125,auVar106);
          auVar125 = vunpcklps_avx(auVar111,auVar124);
          auVar106 = vunpckhps_avx(auVar111,auVar124);
          auVar108 = vunpcklps_avx(auVar126,auVar83);
          auVar124 = vunpckhps_avx(auVar126,auVar83);
          auVar96 = *(undefined1 (*) [16])(lVar22 + uVar36 * 4);
          auVar83 = vunpcklps_avx(auVar106,auVar124);
          auVar111 = vunpcklps_avx(auVar125,auVar108);
          auVar106 = vunpckhps_avx(auVar125,auVar108);
          auVar124 = vunpcklps_avx(auVar84,auVar123);
          auVar123 = vunpckhps_avx(auVar84,auVar123);
          auVar125 = vunpcklps_avx(auVar86,auVar96);
          auVar96 = vunpckhps_avx(auVar86,auVar96);
          auVar86 = *(undefined1 (*) [16])(lVar22 + uVar27 * 4);
          auVar84 = vunpcklps_avx(auVar123,auVar96);
          auVar108 = vunpcklps_avx(auVar124,auVar125);
          auVar96 = vunpckhps_avx(auVar124,auVar125);
          auVar125 = vunpcklps_avx(auVar85,auVar86);
          auVar124 = vunpckhps_avx(auVar85,auVar86);
          auVar86 = *(undefined1 (*) [16])(lVar22 + uVar31 * 4);
          auVar123 = *(undefined1 (*) [16])(lVar22 + uVar23 * 4);
          auVar85 = vunpcklps_avx(auVar86,auVar123);
          auVar86 = vunpckhps_avx(auVar86,auVar123);
          auVar126 = vunpcklps_avx(auVar124,auVar86);
          auVar127 = vunpcklps_avx(auVar125,auVar85);
          auVar124 = vunpckhps_avx(auVar125,auVar85);
          auVar86 = *(undefined1 (*) [16])(lVar22 + uVar30 * 4);
          auVar123 = *(undefined1 (*) [16])(lVar22 + uVar35 * 4);
          auVar85 = vunpcklps_avx(auVar86,auVar123);
          auVar125 = vunpckhps_avx(auVar86,auVar123);
          auVar86 = *(undefined1 (*) [16])(lVar22 + uVar32 * 4);
          auVar123 = *(undefined1 (*) [16])(lVar22 + uVar18 * 4);
          auVar55 = vunpcklps_avx(auVar86,auVar123);
          auVar86 = vunpckhps_avx(auVar86,auVar123);
          auVar72 = vunpcklps_avx(auVar125,auVar86);
          auVar87 = vunpcklps_avx(auVar85,auVar55);
          auVar125 = vunpckhps_avx(auVar85,auVar55);
          auVar86 = vshufps_avx(ZEXT416((uint)fVar54),ZEXT416((uint)fVar54),0);
          auVar123 = vshufps_avx(ZEXT416((uint)(1.0 - fVar54)),ZEXT416((uint)(1.0 - fVar54)),0);
          fVar81 = auVar86._0_4_;
          fVar99 = auVar86._4_4_;
          fVar101 = auVar86._8_4_;
          fVar103 = auVar86._12_4_;
          fVar54 = auVar123._0_4_;
          fVar66 = auVar123._4_4_;
          fVar168 = auVar123._8_4_;
          fVar170 = auVar123._12_4_;
          auVar133._0_4_ = fVar54 * auVar110._0_4_ + fVar81 * auVar108._0_4_;
          auVar133._4_4_ = fVar66 * auVar110._4_4_ + fVar99 * auVar108._4_4_;
          auVar133._8_4_ = fVar168 * auVar110._8_4_ + fVar101 * auVar108._8_4_;
          auVar133._12_4_ = fVar170 * auVar110._12_4_ + fVar103 * auVar108._12_4_;
          auVar138._0_4_ = fVar54 * auVar82._0_4_ + fVar81 * auVar96._0_4_;
          auVar138._4_4_ = fVar66 * auVar82._4_4_ + fVar99 * auVar96._4_4_;
          auVar138._8_4_ = fVar168 * auVar82._8_4_ + fVar101 * auVar96._8_4_;
          auVar138._12_4_ = fVar170 * auVar82._12_4_ + fVar103 * auVar96._12_4_;
          local_11f8._0_4_ = auVar109._0_4_;
          local_11f8._4_4_ = auVar109._4_4_;
          fStack_11f0 = auVar109._8_4_;
          fStack_11ec = auVar109._12_4_;
          auVar112._0_4_ = fVar54 * (float)local_11f8._0_4_ + fVar81 * auVar84._0_4_;
          auVar112._4_4_ = fVar66 * (float)local_11f8._4_4_ + fVar99 * auVar84._4_4_;
          auVar112._8_4_ = fVar168 * fStack_11f0 + fVar101 * auVar84._8_4_;
          auVar112._12_4_ = fVar170 * fStack_11ec + fVar103 * auVar84._12_4_;
          auVar146._0_4_ = fVar54 * auVar107._0_4_ + fVar81 * auVar127._0_4_;
          auVar146._4_4_ = fVar66 * auVar107._4_4_ + fVar99 * auVar127._4_4_;
          auVar146._8_4_ = fVar168 * auVar107._8_4_ + fVar101 * auVar127._8_4_;
          auVar146._12_4_ = fVar170 * auVar107._12_4_ + fVar103 * auVar127._12_4_;
          auVar129._0_4_ = fVar54 * auVar70._0_4_ + fVar81 * auVar124._0_4_;
          auVar129._4_4_ = fVar66 * auVar70._4_4_ + fVar99 * auVar124._4_4_;
          auVar129._8_4_ = fVar168 * auVar70._8_4_ + fVar101 * auVar124._8_4_;
          auVar129._12_4_ = fVar170 * auVar70._12_4_ + fVar103 * auVar124._12_4_;
          puVar2 = (undefined8 *)(uVar40 + 0x30 + lVar37);
          local_f88 = *puVar2;
          uStack_f80 = puVar2[1];
          puVar2 = (undefined8 *)(uVar40 + 0x40 + lVar37);
          local_1218._0_4_ = auVar71._0_4_;
          local_1218._4_4_ = auVar71._4_4_;
          fStack_1210 = auVar71._8_4_;
          fStack_120c = auVar71._12_4_;
          auVar56._0_4_ = fVar54 * (float)local_1218._0_4_ + fVar81 * auVar126._0_4_;
          auVar56._4_4_ = fVar66 * (float)local_1218._4_4_ + fVar99 * auVar126._4_4_;
          auVar56._8_4_ = fVar168 * fStack_1210 + fVar101 * auVar126._8_4_;
          auVar56._12_4_ = fVar170 * fStack_120c + fVar103 * auVar126._12_4_;
          local_11c8._0_4_ = auVar111._0_4_;
          local_11c8._4_4_ = auVar111._4_4_;
          fStack_11c0 = auVar111._8_4_;
          fStack_11bc = auVar111._12_4_;
          auVar73._0_4_ = fVar54 * (float)local_11c8._0_4_ + fVar81 * auVar87._0_4_;
          auVar73._4_4_ = fVar66 * (float)local_11c8._4_4_ + fVar99 * auVar87._4_4_;
          auVar73._8_4_ = fVar168 * fStack_11c0 + fVar101 * auVar87._8_4_;
          auVar73._12_4_ = fVar170 * fStack_11bc + fVar103 * auVar87._12_4_;
          local_1238._0_4_ = auVar106._0_4_;
          local_1238._4_4_ = auVar106._4_4_;
          fStack_1230 = auVar106._8_4_;
          fStack_122c = auVar106._12_4_;
          auVar186._0_4_ = fVar54 * (float)local_1238._0_4_ + fVar81 * auVar125._0_4_;
          auVar186._4_4_ = fVar66 * (float)local_1238._4_4_ + fVar99 * auVar125._4_4_;
          auVar186._8_4_ = fVar168 * fStack_1230 + fVar101 * auVar125._8_4_;
          auVar186._12_4_ = fVar170 * fStack_122c + fVar103 * auVar125._12_4_;
          local_1228._0_4_ = auVar83._0_4_;
          local_1228._4_4_ = auVar83._4_4_;
          fStack_1220 = auVar83._8_4_;
          fStack_121c = auVar83._12_4_;
          auVar155._0_4_ = fVar81 * auVar72._0_4_ + fVar54 * (float)local_1228._0_4_;
          auVar155._4_4_ = fVar99 * auVar72._4_4_ + fVar66 * (float)local_1228._4_4_;
          auVar155._8_4_ = fVar101 * auVar72._8_4_ + fVar168 * fStack_1220;
          auVar155._12_4_ = fVar103 * auVar72._12_4_ + fVar170 * fStack_121c;
          local_1118 = *puVar2;
          uStack_1110 = puVar2[1];
          uVar21 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar42._4_4_ = uVar21;
          auVar42._0_4_ = uVar21;
          auVar42._8_4_ = uVar21;
          auVar42._12_4_ = uVar21;
          uVar21 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar173._4_4_ = uVar21;
          auVar173._0_4_ = uVar21;
          auVar173._8_4_ = uVar21;
          auVar173._12_4_ = uVar21;
          uVar21 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar179._4_4_ = uVar21;
          auVar179._0_4_ = uVar21;
          auVar179._8_4_ = uVar21;
          auVar179._12_4_ = uVar21;
          _local_1218 = vsubps_avx(auVar133,auVar42);
          _local_1228 = vsubps_avx(auVar138,auVar173);
          _local_1238 = vsubps_avx(auVar112,auVar179);
          auVar86 = vsubps_avx(auVar146,auVar42);
          auVar123 = vsubps_avx(auVar129,auVar173);
          auVar96 = vsubps_avx(auVar56,auVar179);
          auVar70 = vsubps_avx(auVar73,auVar42);
          auVar82 = vsubps_avx(auVar186,auVar173);
          auVar106 = vsubps_avx(auVar155,auVar179);
          _local_11c8 = vsubps_avx(auVar70,_local_1218);
          local_11d8 = vsubps_avx(auVar82,_local_1228);
          local_11e8 = vsubps_avx(auVar106,_local_1238);
          fVar168 = local_1228._0_4_;
          fVar54 = auVar82._0_4_ + fVar168;
          fVar99 = local_1228._4_4_;
          fVar66 = auVar82._4_4_ + fVar99;
          fVar9 = local_1228._8_4_;
          fVar67 = auVar82._8_4_ + fVar9;
          fVar12 = local_1228._12_4_;
          fVar68 = auVar82._12_4_ + fVar12;
          fVar170 = local_1238._0_4_;
          fVar104 = auVar106._0_4_ + fVar170;
          fVar101 = local_1238._4_4_;
          fVar115 = auVar106._4_4_ + fVar101;
          fVar10 = local_1238._8_4_;
          fVar117 = auVar106._8_4_ + fVar10;
          fVar13 = local_1238._12_4_;
          fVar120 = auVar106._12_4_ + fVar13;
          fVar69 = local_11e8._0_4_;
          auVar147._0_4_ = fVar69 * fVar54;
          fVar51 = local_11e8._4_4_;
          auVar147._4_4_ = fVar51 * fVar66;
          fVar52 = local_11e8._8_4_;
          auVar147._8_4_ = fVar52 * fVar67;
          fVar53 = local_11e8._12_4_;
          auVar147._12_4_ = fVar53 * fVar68;
          fVar185 = local_11d8._0_4_;
          auVar156._0_4_ = fVar185 * fVar104;
          fVar188 = local_11d8._4_4_;
          auVar156._4_4_ = fVar188 * fVar115;
          fVar189 = local_11d8._8_4_;
          auVar156._8_4_ = fVar189 * fVar117;
          fVar190 = local_11d8._12_4_;
          auVar156._12_4_ = fVar190 * fVar120;
          auVar124 = vsubps_avx(auVar156,auVar147);
          fVar81 = local_1218._0_4_;
          fVar145 = auVar70._0_4_ + fVar81;
          fVar103 = local_1218._4_4_;
          fVar152 = auVar70._4_4_ + fVar103;
          fVar11 = local_1218._8_4_;
          fVar153 = auVar70._8_4_ + fVar11;
          fVar14 = local_1218._12_4_;
          fVar154 = auVar70._12_4_ + fVar14;
          fVar178 = local_11c8._0_4_;
          auVar113._0_4_ = fVar178 * fVar104;
          fVar182 = local_11c8._4_4_;
          auVar113._4_4_ = fVar182 * fVar115;
          fVar183 = local_11c8._8_4_;
          auVar113._8_4_ = fVar183 * fVar117;
          fVar184 = local_11c8._12_4_;
          auVar113._12_4_ = fVar184 * fVar120;
          auVar157._0_4_ = fVar145 * fVar69;
          auVar157._4_4_ = fVar152 * fVar51;
          auVar157._8_4_ = fVar153 * fVar52;
          auVar157._12_4_ = fVar154 * fVar53;
          auVar125 = vsubps_avx(auVar157,auVar113);
          auVar148._0_4_ = fVar185 * fVar145;
          auVar148._4_4_ = fVar188 * fVar152;
          auVar148._8_4_ = fVar189 * fVar153;
          auVar148._12_4_ = fVar190 * fVar154;
          auVar43._0_4_ = fVar178 * fVar54;
          auVar43._4_4_ = fVar182 * fVar66;
          auVar43._8_4_ = fVar183 * fVar67;
          auVar43._12_4_ = fVar184 * fVar68;
          auVar71 = vsubps_avx(auVar43,auVar148);
          fVar54 = (ray->super_RayK<1>).dir.field_0.m128[2];
          local_1278._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
          fVar66 = (ray->super_RayK<1>).dir.field_0.m128[0];
          local_1268._0_4_ =
               auVar124._0_4_ * fVar66 + local_1278._4_4_ * auVar125._0_4_ + fVar54 * auVar71._0_4_;
          local_1268._4_4_ =
               auVar124._4_4_ * fVar66 + local_1278._4_4_ * auVar125._4_4_ + fVar54 * auVar71._4_4_;
          local_1268._8_4_ =
               auVar124._8_4_ * fVar66 + local_1278._4_4_ * auVar125._8_4_ + fVar54 * auVar71._8_4_;
          local_1268._12_4_ =
               auVar124._12_4_ * fVar66 +
               local_1278._4_4_ * auVar125._12_4_ + fVar54 * auVar71._12_4_;
          _local_11f8 = vsubps_avx(_local_1228,auVar123);
          local_fa8 = vsubps_avx(_local_1238,auVar96);
          fVar68 = fVar168 + auVar123._0_4_;
          fVar115 = fVar99 + auVar123._4_4_;
          fVar120 = fVar9 + auVar123._8_4_;
          fVar152 = fVar12 + auVar123._12_4_;
          fVar153 = fVar170 + auVar96._0_4_;
          fVar154 = fVar101 + auVar96._4_4_;
          fVar118 = fVar10 + auVar96._8_4_;
          fVar121 = fVar13 + auVar96._12_4_;
          fVar67 = local_fa8._0_4_;
          auVar180._0_4_ = fVar67 * fVar68;
          fVar104 = local_fa8._4_4_;
          auVar180._4_4_ = fVar104 * fVar115;
          fVar117 = local_fa8._8_4_;
          auVar180._8_4_ = fVar117 * fVar120;
          fVar145 = local_fa8._12_4_;
          auVar180._12_4_ = fVar145 * fVar152;
          fVar172 = local_11f8._0_4_;
          auVar88._0_4_ = fVar172 * fVar153;
          fVar175 = local_11f8._4_4_;
          auVar88._4_4_ = fVar175 * fVar154;
          fVar176 = local_11f8._8_4_;
          auVar88._8_4_ = fVar176 * fVar118;
          fVar177 = local_11f8._12_4_;
          auVar88._12_4_ = fVar177 * fVar121;
          auVar124 = vsubps_avx(auVar88,auVar180);
          local_f98 = vsubps_avx(_local_1218,auVar86);
          fVar160 = local_f98._0_4_;
          auVar114._0_4_ = fVar160 * fVar153;
          fVar162 = local_f98._4_4_;
          auVar114._4_4_ = fVar162 * fVar154;
          fVar163 = local_f98._8_4_;
          auVar114._8_4_ = fVar163 * fVar118;
          fVar164 = local_f98._12_4_;
          auVar114._12_4_ = fVar164 * fVar121;
          fVar153 = fVar81 + auVar86._0_4_;
          fVar154 = fVar103 + auVar86._4_4_;
          fVar118 = fVar11 + auVar86._8_4_;
          fVar121 = fVar14 + auVar86._12_4_;
          auVar149._0_4_ = fVar67 * fVar153;
          auVar149._4_4_ = fVar104 * fVar154;
          auVar149._8_4_ = fVar117 * fVar118;
          auVar149._12_4_ = fVar145 * fVar121;
          auVar125 = vsubps_avx(auVar149,auVar114);
          auVar139._0_4_ = fVar172 * fVar153;
          auVar139._4_4_ = fVar175 * fVar154;
          auVar139._8_4_ = fVar176 * fVar118;
          auVar139._12_4_ = fVar177 * fVar121;
          auVar44._0_4_ = fVar160 * fVar68;
          auVar44._4_4_ = fVar162 * fVar115;
          auVar44._8_4_ = fVar163 * fVar120;
          auVar44._12_4_ = fVar164 * fVar152;
          auVar71 = vsubps_avx(auVar44,auVar139);
          local_10f8._0_4_ =
               fVar66 * auVar124._0_4_ + local_1278._4_4_ * auVar125._0_4_ + fVar54 * auVar71._0_4_;
          local_10f8._4_4_ =
               fVar66 * auVar124._4_4_ + local_1278._4_4_ * auVar125._4_4_ + fVar54 * auVar71._4_4_;
          local_10f8._8_4_ =
               fVar66 * auVar124._8_4_ + local_1278._4_4_ * auVar125._8_4_ + fVar54 * auVar71._8_4_;
          local_10f8._12_4_ =
               fVar66 * auVar124._12_4_ +
               local_1278._4_4_ * auVar125._12_4_ + fVar54 * auVar71._12_4_;
          auVar124 = vsubps_avx(auVar86,auVar70);
          fVar80 = auVar86._0_4_ + auVar70._0_4_;
          fVar98 = auVar86._4_4_ + auVar70._4_4_;
          fVar100 = auVar86._8_4_ + auVar70._8_4_;
          fVar102 = auVar86._12_4_ + auVar70._12_4_;
          auVar86 = vsubps_avx(auVar123,auVar82);
          fVar154 = auVar123._0_4_ + auVar82._0_4_;
          fVar118 = auVar123._4_4_ + auVar82._4_4_;
          fVar121 = auVar123._8_4_ + auVar82._8_4_;
          fVar79 = auVar123._12_4_ + auVar82._12_4_;
          auVar123 = vsubps_avx(auVar96,auVar106);
          fVar115 = auVar96._0_4_ + auVar106._0_4_;
          fVar120 = auVar96._4_4_ + auVar106._4_4_;
          fVar152 = auVar96._8_4_ + auVar106._8_4_;
          fVar153 = auVar96._12_4_ + auVar106._12_4_;
          fVar105 = auVar123._0_4_;
          auVar130._0_4_ = fVar105 * fVar154;
          fVar116 = auVar123._4_4_;
          auVar130._4_4_ = fVar116 * fVar118;
          fVar119 = auVar123._8_4_;
          auVar130._8_4_ = fVar119 * fVar121;
          fVar122 = auVar123._12_4_;
          auVar130._12_4_ = fVar122 * fVar79;
          fVar165 = auVar86._0_4_;
          auVar140._0_4_ = fVar165 * fVar115;
          fVar167 = auVar86._4_4_;
          auVar140._4_4_ = fVar167 * fVar120;
          fVar169 = auVar86._8_4_;
          auVar140._8_4_ = fVar169 * fVar152;
          fVar171 = auVar86._12_4_;
          auVar140._12_4_ = fVar171 * fVar153;
          auVar86 = vsubps_avx(auVar140,auVar130);
          fVar68 = auVar124._0_4_;
          auVar57._0_4_ = fVar68 * fVar115;
          fVar115 = auVar124._4_4_;
          auVar57._4_4_ = fVar115 * fVar120;
          fVar120 = auVar124._8_4_;
          auVar57._8_4_ = fVar120 * fVar152;
          fVar152 = auVar124._12_4_;
          auVar57._12_4_ = fVar152 * fVar153;
          auVar141._0_4_ = fVar105 * fVar80;
          auVar141._4_4_ = fVar116 * fVar98;
          auVar141._8_4_ = fVar119 * fVar100;
          auVar141._12_4_ = fVar122 * fVar102;
          auVar123 = vsubps_avx(auVar141,auVar57);
          auVar89._0_4_ = fVar165 * fVar80;
          auVar89._4_4_ = fVar167 * fVar98;
          auVar89._8_4_ = fVar169 * fVar100;
          auVar89._12_4_ = fVar171 * fVar102;
          auVar74._0_4_ = fVar68 * fVar154;
          auVar74._4_4_ = fVar115 * fVar118;
          auVar74._8_4_ = fVar120 * fVar121;
          auVar74._12_4_ = fVar152 * fVar79;
          auVar96 = vsubps_avx(auVar74,auVar89);
          local_1278._0_4_ = local_1278._4_4_;
          fStack_1270 = local_1278._4_4_;
          fStack_126c = local_1278._4_4_;
          auVar58._0_4_ =
               fVar66 * auVar86._0_4_ + local_1278._4_4_ * auVar123._0_4_ + fVar54 * auVar96._0_4_;
          auVar58._4_4_ =
               fVar66 * auVar86._4_4_ + local_1278._4_4_ * auVar123._4_4_ + fVar54 * auVar96._4_4_;
          auVar58._8_4_ =
               fVar66 * auVar86._8_4_ + local_1278._4_4_ * auVar123._8_4_ + fVar54 * auVar96._8_4_;
          auVar58._12_4_ =
               fVar66 * auVar86._12_4_ +
               local_1278._4_4_ * auVar123._12_4_ + fVar54 * auVar96._12_4_;
          local_10e8._0_4_ = auVar58._0_4_ + local_1268._0_4_ + local_10f8._0_4_;
          local_10e8._4_4_ = auVar58._4_4_ + local_1268._4_4_ + local_10f8._4_4_;
          local_10e8._8_4_ = auVar58._8_4_ + local_1268._8_4_ + local_10f8._8_4_;
          local_10e8._12_4_ = auVar58._12_4_ + local_1268._12_4_ + local_10f8._12_4_;
          auVar86 = vminps_avx(local_1268,local_10f8);
          auVar86 = vminps_avx(auVar86,auVar58);
          auVar90._8_4_ = 0x7fffffff;
          auVar90._0_8_ = 0x7fffffff7fffffff;
          auVar90._12_4_ = 0x7fffffff;
          local_fb8 = vandps_avx(local_10e8,auVar90);
          auVar91._0_4_ = local_fb8._0_4_ * 1.1920929e-07;
          auVar91._4_4_ = local_fb8._4_4_ * 1.1920929e-07;
          auVar91._8_4_ = local_fb8._8_4_ * 1.1920929e-07;
          auVar91._12_4_ = local_fb8._12_4_ * 1.1920929e-07;
          uVar27 = CONCAT44(auVar91._4_4_,auVar91._0_4_);
          auVar131._0_8_ = uVar27 ^ 0x8000000080000000;
          auVar131._8_4_ = -auVar91._8_4_;
          auVar131._12_4_ = -auVar91._12_4_;
          auVar86 = vcmpps_avx(auVar86,auVar131,5);
          auVar123 = vmaxps_avx(local_1268,local_10f8);
          auVar123 = vmaxps_avx(auVar123,auVar58);
          auVar123 = vcmpps_avx(auVar123,auVar91,2);
          local_fc8 = vorps_avx(auVar86,auVar123);
          local_12a1 = 0;
          auVar15._8_8_ = uStack_1120;
          auVar15._0_8_ = local_1128;
          auVar15 = auVar15 & local_fc8;
          if ((((auVar15 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar15[0xf] < '\0') {
            auVar59._0_4_ = fVar69 * fVar172;
            auVar59._4_4_ = fVar51 * fVar175;
            auVar59._8_4_ = fVar52 * fVar176;
            auVar59._12_4_ = fVar53 * fVar177;
            auVar75._0_4_ = fVar185 * fVar67;
            auVar75._4_4_ = fVar188 * fVar104;
            auVar75._8_4_ = fVar189 * fVar117;
            auVar75._12_4_ = fVar190 * fVar145;
            auVar96 = vsubps_avx(auVar75,auVar59);
            auVar92._0_4_ = fVar165 * fVar67;
            auVar92._4_4_ = fVar167 * fVar104;
            auVar92._8_4_ = fVar169 * fVar117;
            auVar92._12_4_ = fVar171 * fVar145;
            auVar132._0_4_ = fVar172 * fVar105;
            auVar132._4_4_ = fVar175 * fVar116;
            auVar132._8_4_ = fVar176 * fVar119;
            auVar132._12_4_ = fVar177 * fVar122;
            auVar70 = vsubps_avx(auVar132,auVar92);
            auVar142._8_4_ = 0x7fffffff;
            auVar142._0_8_ = 0x7fffffff7fffffff;
            auVar142._12_4_ = 0x7fffffff;
            auVar86 = vandps_avx(auVar59,auVar142);
            auVar123 = vandps_avx(auVar92,auVar142);
            auVar86 = vcmpps_avx(auVar86,auVar123,1);
            local_1088 = vblendvps_avx(auVar70,auVar96,auVar86);
            auVar60._0_4_ = fVar160 * fVar105;
            auVar60._4_4_ = fVar162 * fVar116;
            auVar60._8_4_ = fVar163 * fVar119;
            auVar60._12_4_ = fVar164 * fVar122;
            auVar76._0_4_ = fVar69 * fVar160;
            auVar76._4_4_ = fVar51 * fVar162;
            auVar76._8_4_ = fVar52 * fVar163;
            auVar76._12_4_ = fVar53 * fVar164;
            auVar93._0_4_ = fVar178 * fVar67;
            auVar93._4_4_ = fVar182 * fVar104;
            auVar93._8_4_ = fVar183 * fVar117;
            auVar93._12_4_ = fVar184 * fVar145;
            auVar96 = vsubps_avx(auVar76,auVar93);
            auVar134._0_4_ = fVar67 * fVar68;
            auVar134._4_4_ = fVar104 * fVar115;
            auVar134._8_4_ = fVar117 * fVar120;
            auVar134._12_4_ = fVar145 * fVar152;
            auVar70 = vsubps_avx(auVar134,auVar60);
            auVar86 = vandps_avx(auVar93,auVar142);
            auVar123 = vandps_avx(auVar60,auVar142);
            auVar86 = vcmpps_avx(auVar86,auVar123,1);
            local_1078 = vblendvps_avx(auVar70,auVar96,auVar86);
            auVar45._0_4_ = fVar172 * fVar68;
            auVar45._4_4_ = fVar175 * fVar115;
            auVar45._8_4_ = fVar176 * fVar120;
            auVar45._12_4_ = fVar177 * fVar152;
            auVar77._0_4_ = fVar178 * fVar172;
            auVar77._4_4_ = fVar182 * fVar175;
            auVar77._8_4_ = fVar183 * fVar176;
            auVar77._12_4_ = fVar184 * fVar177;
            auVar94._0_4_ = fVar185 * fVar160;
            auVar94._4_4_ = fVar188 * fVar162;
            auVar94._8_4_ = fVar189 * fVar163;
            auVar94._12_4_ = fVar190 * fVar164;
            auVar135._0_4_ = fVar160 * fVar165;
            auVar135._4_4_ = fVar162 * fVar167;
            auVar135._8_4_ = fVar163 * fVar169;
            auVar135._12_4_ = fVar164 * fVar171;
            auVar96 = vsubps_avx(auVar77,auVar94);
            auVar70 = vsubps_avx(auVar135,auVar45);
            auVar86 = vandps_avx(auVar94,auVar142);
            auVar123 = vandps_avx(auVar45,auVar142);
            auVar86 = vcmpps_avx(auVar86,auVar123,1);
            local_1068 = vblendvps_avx(auVar70,auVar96,auVar86);
            fVar69 = local_1088._0_4_ * fVar66 +
                     local_1078._0_4_ * local_1278._4_4_ + local_1068._0_4_ * fVar54;
            fVar67 = local_1088._4_4_ * fVar66 +
                     local_1078._4_4_ * local_1278._4_4_ + local_1068._4_4_ * fVar54;
            fVar68 = local_1088._8_4_ * fVar66 +
                     local_1078._8_4_ * local_1278._4_4_ + local_1068._8_4_ * fVar54;
            fVar54 = local_1088._12_4_ * fVar66 +
                     local_1078._12_4_ * local_1278._4_4_ + local_1068._12_4_ * fVar54;
            auVar78._0_4_ = fVar69 + fVar69;
            auVar78._4_4_ = fVar67 + fVar67;
            auVar78._8_4_ = fVar68 + fVar68;
            auVar78._12_4_ = fVar54 + fVar54;
            fVar81 = local_1088._0_4_ * fVar81 +
                     local_1078._0_4_ * fVar168 + local_1068._0_4_ * fVar170;
            fVar99 = local_1088._4_4_ * fVar103 +
                     local_1078._4_4_ * fVar99 + local_1068._4_4_ * fVar101;
            fVar101 = local_1088._8_4_ * fVar11 +
                      local_1078._8_4_ * fVar9 + local_1068._8_4_ * fVar10;
            fVar103 = local_1088._12_4_ * fVar14 +
                      local_1078._12_4_ * fVar12 + local_1068._12_4_ * fVar13;
            auVar86 = vrcpps_avx(auVar78);
            fVar54 = auVar86._0_4_;
            auVar143._0_4_ = auVar78._0_4_ * fVar54;
            fVar66 = auVar86._4_4_;
            auVar143._4_4_ = auVar78._4_4_ * fVar66;
            fVar168 = auVar86._8_4_;
            auVar143._8_4_ = auVar78._8_4_ * fVar168;
            fVar170 = auVar86._12_4_;
            auVar143._12_4_ = auVar78._12_4_ * fVar170;
            auVar150._8_4_ = 0x3f800000;
            auVar150._0_8_ = 0x3f8000003f800000;
            auVar150._12_4_ = 0x3f800000;
            auVar86 = vsubps_avx(auVar150,auVar143);
            local_1098._0_4_ = (fVar81 + fVar81) * (fVar54 + fVar54 * auVar86._0_4_);
            local_1098._4_4_ = (fVar99 + fVar99) * (fVar66 + fVar66 * auVar86._4_4_);
            local_1098._8_4_ = (fVar101 + fVar101) * (fVar168 + fVar168 * auVar86._8_4_);
            local_1098._12_4_ = (fVar103 + fVar103) * (fVar170 + fVar170 * auVar86._12_4_);
            auVar50 = ZEXT1664(local_1098);
            uVar21 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar95._4_4_ = uVar21;
            auVar95._0_4_ = uVar21;
            auVar95._8_4_ = uVar21;
            auVar95._12_4_ = uVar21;
            auVar86 = vcmpps_avx(auVar95,local_1098,2);
            fVar54 = (ray->super_RayK<1>).tfar;
            auVar136._4_4_ = fVar54;
            auVar136._0_4_ = fVar54;
            auVar136._8_4_ = fVar54;
            auVar136._12_4_ = fVar54;
            auVar123 = vcmpps_avx(local_1098,auVar136,2);
            auVar86 = vandps_avx(auVar86,auVar123);
            auVar123 = vcmpps_avx(auVar78,_DAT_01f45a50,4);
            auVar86 = vandps_avx(auVar123,auVar86);
            auVar16._8_8_ = uStack_1120;
            auVar16._0_8_ = local_1128;
            auVar123 = vandps_avx(local_fc8,auVar16);
            auVar86 = vpslld_avx(auVar86,0x1f);
            auVar96 = vpsrad_avx(auVar86,0x1f);
            auVar86 = auVar123 & auVar96;
            if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar86 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar86 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar86[0xf] < '\0') {
              auVar5._0_4_ = (ray->super_RayK<1>).tfar;
              auVar5._4_4_ = (ray->super_RayK<1>).mask;
              auVar5._8_4_ = (ray->super_RayK<1>).id;
              auVar5._12_4_ = (ray->super_RayK<1>).flags;
              auVar65 = ZEXT1664(auVar5);
              auVar123 = vandps_avx(auVar96,auVar123);
              local_1108 = local_1268;
              local_10d8 = &local_12a1;
              local_10c8 = auVar123;
              local_1208 = auVar123;
              auVar86 = vrcpps_avx(local_10e8);
              fVar54 = auVar86._0_4_;
              auVar61._0_4_ = local_10e8._0_4_ * fVar54;
              fVar66 = auVar86._4_4_;
              auVar61._4_4_ = local_10e8._4_4_ * fVar66;
              fVar168 = auVar86._8_4_;
              auVar61._8_4_ = local_10e8._8_4_ * fVar168;
              fVar170 = auVar86._12_4_;
              auVar61._12_4_ = local_10e8._12_4_ * fVar170;
              auVar97._8_4_ = 0x3f800000;
              auVar97._0_8_ = 0x3f8000003f800000;
              auVar97._12_4_ = 0x3f800000;
              auVar86 = vsubps_avx(auVar97,auVar61);
              auVar46._0_4_ = fVar54 + fVar54 * auVar86._0_4_;
              auVar46._4_4_ = fVar66 + fVar66 * auVar86._4_4_;
              auVar46._8_4_ = fVar168 + fVar168 * auVar86._8_4_;
              auVar46._12_4_ = fVar170 + fVar170 * auVar86._12_4_;
              auVar62._8_4_ = 0x219392ef;
              auVar62._0_8_ = 0x219392ef219392ef;
              auVar62._12_4_ = 0x219392ef;
              auVar86 = vcmpps_avx(local_fb8,auVar62,5);
              auVar86 = vandps_avx(auVar86,auVar46);
              auVar63._0_4_ = local_1268._0_4_ * auVar86._0_4_;
              auVar63._4_4_ = local_1268._4_4_ * auVar86._4_4_;
              auVar63._8_4_ = local_1268._8_4_ * auVar86._8_4_;
              auVar63._12_4_ = local_1268._12_4_ * auVar86._12_4_;
              local_10b8 = vminps_avx(auVar63,auVar97);
              auVar47._0_4_ = local_10f8._0_4_ * auVar86._0_4_;
              auVar47._4_4_ = local_10f8._4_4_ * auVar86._4_4_;
              auVar47._8_4_ = local_10f8._8_4_ * auVar86._8_4_;
              auVar47._12_4_ = local_10f8._12_4_ * auVar86._12_4_;
              local_10a8 = vminps_avx(auVar47,auVar97);
              auVar48._8_4_ = 0x7f800000;
              auVar48._0_8_ = 0x7f8000007f800000;
              auVar48._12_4_ = 0x7f800000;
              auVar86 = vblendvps_avx(auVar48,local_1098,auVar123);
              auVar96 = vshufps_avx(auVar86,auVar86,0xb1);
              auVar96 = vminps_avx(auVar96,auVar86);
              auVar70 = vshufpd_avx(auVar96,auVar96,1);
              auVar96 = vminps_avx(auVar70,auVar96);
              auVar86 = vcmpps_avx(auVar86,auVar96,0);
              auVar96 = auVar123 & auVar86;
              if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar96[0xf] < '\0') {
                auVar123 = vandps_avx(auVar86,auVar123);
              }
              uVar19 = vextractps_avx(auVar5,1);
              uVar20 = vmovmskps_avx(auVar123);
              lVar34 = 0;
              local_1298 = pSVar29;
              if (uVar20 != 0) {
                for (; (uVar20 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                }
              }
LAB_00b70d51:
              local_1150 = *(uint *)((long)&local_f88 + lVar34 * 4);
              auVar24 = (undefined1  [8])(ulong)local_1150;
              pGVar8 = (pSVar29->geometries).items[(long)auVar24].ptr;
              if ((pGVar8->mask & uVar19) == 0) {
                *(undefined4 *)(local_1208 + lVar34 * 4) = 0;
              }
              else {
                pRVar38 = local_1290->args;
                local_1288 = auVar65._0_16_;
                if (pRVar38->filter == (RTCFilterFunctionN)0x0) {
                  local_1198.context = local_1290->user;
                  if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar54 = *(float *)(local_10b8 + lVar34 * 4);
                    fVar66 = *(float *)(local_10a8 + lVar34 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_1098 + lVar34 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1088 + lVar34 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_1078 + lVar34 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_1068 + lVar34 * 4);
                    ray->u = fVar54;
                    ray->v = fVar66;
                    ray->primID = *(uint *)((long)&local_1118 + lVar34 * 4);
                    ray->geomID = local_1150;
                    ray->instID[0] = (local_1198.context)->instID[0];
                    ray->instPrimID[0] = (local_1198.context)->instPrimID[0];
                    goto LAB_00b71080;
                  }
                }
                else {
                  local_1198.context = local_1290->user;
                }
                local_1168 = *(float *)(local_1088 + lVar34 * 4);
                local_1164 = *(undefined4 *)(local_1078 + lVar34 * 4);
                local_1160 = *(undefined4 *)(local_1068 + lVar34 * 4);
                local_115c = *(undefined4 *)(local_10b8 + lVar34 * 4);
                local_1158 = *(undefined4 *)(local_10a8 + lVar34 * 4);
                local_1154 = *(undefined4 *)((long)&local_1118 + lVar34 * 4);
                local_114c = (local_1198.context)->instID[0];
                local_1148 = (local_1198.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = *(float *)(local_1098 + lVar34 * 4);
                local_123c = -1;
                local_1198.valid = &local_123c;
                auVar24 = (undefined1  [8])pGVar8->userPtr;
                local_1198.geometryUserPtr = (void *)auVar24;
                local_1198.ray = (RTCRayN *)ray;
                local_1198.hit = (RTCHitN *)&local_1168;
                local_1198.N = 1;
                local_1218 = (undefined1  [8])pGVar8;
                local_1258 = auVar50._0_16_;
                local_1278 = lVar34;
                if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00b70f29:
                  if ((pRVar38->filter != (RTCFilterFunctionN)0x0) &&
                     (((pRVar38->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (auVar24 = local_1218, (*(byte *)((long)local_1218 + 0x3e) & 0x40) != 0)))) {
                    (*pRVar38->filter)(&local_1198);
                    auVar50 = ZEXT1664(local_1258);
                    pSVar29 = local_1298;
                    lVar34 = local_1278;
                    if (*local_1198.valid == 0) goto LAB_00b70fc8;
                  }
                  (((Vec3f *)((long)local_1198.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_1198.hit;
                  (((Vec3f *)((long)local_1198.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_1198.hit + 4);
                  (((Vec3f *)((long)local_1198.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_1198.hit + 8);
                  *(float *)((long)local_1198.ray + 0x3c) = *(float *)(local_1198.hit + 0xc);
                  *(float *)((long)local_1198.ray + 0x40) = *(float *)(local_1198.hit + 0x10);
                  *(float *)((long)local_1198.ray + 0x44) = *(float *)(local_1198.hit + 0x14);
                  *(float *)((long)local_1198.ray + 0x48) = *(float *)(local_1198.hit + 0x18);
                  *(float *)((long)local_1198.ray + 0x4c) = *(float *)(local_1198.hit + 0x1c);
                  auVar24 = (undefined1  [8])0x0;
                  *(float *)((long)local_1198.ray + 0x50) = *(float *)(local_1198.hit + 0x20);
                }
                else {
                  local_1268._0_8_ = pRVar38;
                  (*pGVar8->intersectionFilterN)(&local_1198);
                  auVar50 = ZEXT1664(local_1258);
                  pSVar29 = local_1298;
                  lVar34 = local_1278;
                  pRVar38 = (RTCIntersectArguments *)local_1268._0_8_;
                  if (*local_1198.valid != 0) goto LAB_00b70f29;
LAB_00b70fc8:
                  (ray->super_RayK<1>).tfar = (float)local_1288._0_4_;
                  pSVar29 = local_1298;
                  lVar34 = local_1278;
                }
                *(undefined4 *)(local_1208 + lVar34 * 4) = 0;
                fVar54 = (ray->super_RayK<1>).tfar;
                auVar49._4_4_ = fVar54;
                auVar49._0_4_ = fVar54;
                auVar49._8_4_ = fVar54;
                auVar49._12_4_ = fVar54;
                auVar86 = vcmpps_avx(auVar50._0_16_,auVar49,2);
                local_1208 = vandps_avx(auVar86,local_1208);
                auVar6._0_4_ = (ray->super_RayK<1>).tfar;
                auVar6._4_4_ = (ray->super_RayK<1>).mask;
                auVar6._8_4_ = (ray->super_RayK<1>).id;
                auVar6._12_4_ = (ray->super_RayK<1>).flags;
                auVar65 = ZEXT1664(auVar6);
                uVar19 = vextractps_avx(auVar6,1);
              }
              if ((((local_1208 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_1208 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_1208 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_1208[0xf]) goto LAB_00b71080;
              auVar64._8_4_ = 0x7f800000;
              auVar64._0_8_ = 0x7f8000007f800000;
              auVar64._12_4_ = 0x7f800000;
              auVar86 = vblendvps_avx(auVar64,auVar50._0_16_,local_1208);
              auVar123 = vshufps_avx(auVar86,auVar86,0xb1);
              auVar123 = vminps_avx(auVar123,auVar86);
              auVar96 = vshufpd_avx(auVar123,auVar123,1);
              auVar123 = vminps_avx(auVar96,auVar123);
              auVar123 = vcmpps_avx(auVar86,auVar123,0);
              auVar96 = local_1208 & auVar123;
              auVar86 = local_1208;
              if ((((auVar96 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar96 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar96 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar96[0xf] < '\0') {
                auVar86 = vandps_avx(auVar123,local_1208);
              }
              uVar21 = vmovmskps_avx(auVar86);
              uVar27 = CONCAT44((int)((ulong)auVar24 >> 0x20),uVar21);
              lVar34 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                }
              }
              goto LAB_00b70d51;
            }
          }
LAB_00b71080:
          auVar151 = ZEXT1664(local_fd8);
          auVar158 = ZEXT1664(local_fe8);
          auVar159 = ZEXT1664(local_ff8);
          auVar161 = ZEXT1664(local_1008);
          auVar166 = ZEXT1664(local_1018);
          auVar174 = ZEXT1664(local_1028);
          auVar181 = ZEXT1664(local_1038);
          auVar187 = ZEXT1664(local_1048);
          auVar144 = ZEXT1664(local_1058);
          auVar137 = ZEXT1664(local_1138);
          uVar27 = local_12a0;
          uVar23 = local_11b8;
        }
        fVar54 = (ray->super_RayK<1>).tfar;
        auVar50 = ZEXT1664(CONCAT412(fVar54,CONCAT48(fVar54,CONCAT44(fVar54,fVar54))));
        auVar65 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
      goto LAB_00b701c5;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }